

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_interpolated_curvature(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  uint uVar1;
  REF_DBL *metric;
  undefined8 uVar2;
  REF_STATUS RVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  
  ref_node = ref_grid->node;
  uVar1 = ref_node->max;
  if ((int)uVar1 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x4fe,
           "ref_metric_interpolated_curvature","malloc metric of REF_DBL negative");
    RVar3 = 1;
  }
  else {
    metric = (REF_DBL *)malloc((ulong)uVar1 * 0x30);
    if (metric == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x4fe,"ref_metric_interpolated_curvature","malloc metric of REF_DBL NULL");
      RVar3 = 2;
    }
    else {
      uVar1 = ref_metric_from_curvature(metric,ref_grid);
      if (uVar1 == 0) {
        iVar5 = 0x15;
        do {
          iVar5 = iVar5 + -1;
          if (iVar5 == 0) {
            uVar1 = ref_metric_to_node(metric,ref_node);
            if (uVar1 == 0) {
              free(metric);
              return 0;
            }
            uVar4 = (ulong)uVar1;
            pcVar6 = "to node";
            uVar2 = 0x503;
            goto LAB_001ad81e;
          }
          uVar1 = ref_metric_mixed_space_gradation(metric,ref_grid,-1.0,-1.0);
        } while (uVar1 == 0);
        uVar4 = (ulong)uVar1;
        pcVar6 = "grad";
        uVar2 = 0x501;
      }
      else {
        uVar4 = (ulong)uVar1;
        pcVar6 = "curve";
        uVar2 = 0x4ff;
      }
LAB_001ad81e:
      RVar3 = (REF_STATUS)uVar4;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar2,"ref_metric_interpolated_curvature",uVar4,pcVar6);
    }
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolated_curvature(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *metric;
  REF_INT gradation;

  ref_malloc(metric, 6 * ref_node_max(ref_node), REF_DBL);
  RSS(ref_metric_from_curvature(metric, ref_grid), "curve");
  for (gradation = 0; gradation < 20; gradation++) {
    RSS(ref_metric_mixed_space_gradation(metric, ref_grid, -1.0, -1.0), "grad");
  }
  RSS(ref_metric_to_node(metric, ref_node), "to node");
  ref_free(metric);

  return REF_SUCCESS;
}